

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_read_uint32_iterator(uint8_t type)

{
  roaring_bitmap_t *buf;
  roaring_uint32_iterator_t *file;
  char in_DIL;
  uint32_t got;
  uint32_t buffer [1];
  roaring_uint32_iterator_t *iter;
  roaring_bitmap_t *in_stack_00000010;
  uint32_t i;
  roaring_bitmap_t *r;
  uint32_t ref_count;
  uint32_t *ref_values;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  uint count;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint32_t in_stack_fffffffffffffff0;
  uint32_t in_stack_fffffffffffffff4;
  undefined7 in_stack_fffffffffffffff8;
  
  test_iterator_generate_data
            ((uint32_t **)in_stack_00000010,(uint32_t *)CONCAT44(iter._4_4_,iter._0_4_));
  buf = roaring_bitmap_create();
  for (count = 0; count < in_stack_ffffffffffffffec; count = count + 1) {
    roaring_bitmap_add(in_stack_00000010,iter._4_4_);
  }
  if (in_DIL != -1) {
    convert_all_containers
              ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (uint8_t)(in_stack_ffffffffffffffec >> 0x18));
  }
  file = roaring_iterator_create
                   ((roaring_bitmap_t *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  roaring_uint32_iterator_read
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(uint32_t *)buf,count);
  _assert_true((unsigned_long)buf,(char *)CONCAT44(count,in_stack_ffffffffffffffd8),(char *)file,
               in_stack_ffffffffffffffcc);
  _assert_true((unsigned_long)buf,(char *)CONCAT44(count,in_stack_ffffffffffffffd8),(char *)file,
               in_stack_ffffffffffffffcc);
  _assert_true((unsigned_long)buf,(char *)CONCAT44(count,in_stack_ffffffffffffffd8),(char *)file,
               in_stack_ffffffffffffffcc);
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x10a19b);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  read_compare(_got,(uint32_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4
               ,in_stack_fffffffffffffff0);
  roaring_bitmap_free((roaring_bitmap_t *)0x10a236);
  free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void test_read_uint32_iterator(uint8_t type) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *r = roaring_bitmap_create();
    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(r, ref_values[i]);
    }
    if (type != UINT8_MAX) {
        convert_all_containers(r, type);
    }

    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t buffer[1];
    uint32_t got = roaring_uint32_iterator_read(iter, buffer, 0);
    assert_true(got == 0);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 0);
    roaring_uint32_iterator_free(iter);

    read_compare(r, ref_values, ref_count, 1);
    read_compare(r, ref_values, ref_count, 2);
    read_compare(r, ref_values, ref_count, 7);
    read_compare(r, ref_values, ref_count, ref_count - 1);
    read_compare(r, ref_values, ref_count, ref_count);
    read_compare(r, ref_values, ref_count, UINT32_MAX);  // special value

    roaring_bitmap_free(r);
    free(ref_values);
}